

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O1

QSize qSmartMaxSize(QWidgetItem *i,Alignment align)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  QSize QVar5;
  long in_FS_OFFSET;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_4c;
  QSize local_48;
  QSize local_40;
  QSize local_38;
  long local_30;
  QWidget *this;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*(i->super_QLayoutItem)._vptr_QLayoutItem[0xd])();
  this = (QWidget *)CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(*(long *)this + 0x70))(this);
  uVar3 = (**(code **)(*(long *)this + 0x78))(this);
  uVar4 = uVar3;
  if ((int)uVar3 < (int)uVar2) {
    uVar4 = uVar2;
  }
  if ((int)(uVar3 >> 0x20) < (int)(uVar2 >> 0x20)) {
    uVar3 = uVar2;
  }
  local_38 = (QSize)(uVar4 & 0xffffffff | uVar3 & 0xffffffff00000000);
  local_40 = QWidget::minimumSize(this);
  local_48 = QWidget::maximumSize(this);
  local_4c.bits = (Bits)QWidget::sizePolicy(this);
  QVar5 = qSmartMaxSize(&local_38,&local_40,&local_48,(QSizePolicy *)&local_4c.bits,align);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QSize qSmartMaxSize(const QWidgetItem *i, Qt::Alignment align)
{
    QWidget *w = i->widget();
    return qSmartMaxSize(w->sizeHint().expandedTo(w->minimumSizeHint()), w->minimumSize(), w->maximumSize(),
                            w->sizePolicy(), align);
}